

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng_test.cpp
# Opt level: O0

void __thiscall RNG_Double_Test::TestBody(RNG_Double_Test *this)

{
  bool bVar1;
  float fVar2;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  double v;
  char *in_stack_00000058;
  int i;
  RNG rng;
  RNG *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  RNG local_38;
  double local_28;
  int local_1c;
  RNG local_18;
  
  pbrt::RNG::RNG(&local_18);
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    local_28 = pbrt::RNG::Uniform<double>(in_stack_ffffffffffffff90);
    fVar2 = (float)local_28;
    in_stack_ffffffffffffff90 = &local_38;
    testing::internal::CmpHelperNE<double,float>
              (in_stack_00000058,(char *)v,(double *)gtest_ar.message_.ptr_,(float *)gtest_ar._0_8_)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)in_stack_ffffffffffffff90);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(fVar2,in_stack_ffffffffffffffc0));
      testing::AssertionResult::failure_message((AssertionResult *)0x6266a5);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(fVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
                 ,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
      testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff90);
      testing::Message::~Message((Message *)0x6266f1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x626731);
  }
  return;
}

Assistant:

TEST(RNG, Double) {
    RNG rng;
    for (int i = 0; i < 10; ++i) {
        double v = rng.Uniform<double>();
        EXPECT_NE(v, float(v));
    }
}